

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O1

void __thiscall
duckdb::TableIndexList::InitializeIndexes
          (TableIndexList *this,ClientContext *context,DataTableInfo *table_info,char *index_type)

{
  pointer puVar1;
  pointer pcVar2;
  _Head_base<0UL,_duckdb::Index_*,_false> _Var3;
  bool bVar4;
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> uVar5;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry_00;
  int iVar6;
  pointer pIVar7;
  undefined4 extraout_var;
  Catalog *this_00;
  ColumnList *this_01;
  TableCatalogEntry *pTVar8;
  ColumnDefinition *this_02;
  LogicalType *__x;
  string *__x_00;
  undefined4 extraout_var_00;
  Binder *pBVar9;
  type binder_00;
  bool bVar10;
  _Hash_node_base *p_Var11;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer puVar12;
  _func_int **pp_Var13;
  ColumnListIterator CVar14;
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> bound_idx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<duckdb::LogicalType,_true> column_types;
  string schema;
  vector<duckdb::ColumnIndex,_true> dummy_column_ids;
  shared_ptr<duckdb::Binder,_true> binder;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  undefined1 local_b8 [104];
  string table_name;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  puVar12 = (this->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 == puVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  bVar10 = false;
  do {
    pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (puVar12);
    iVar6 = (*pIVar7->_vptr_Index[2])(pIVar7);
    if ((char)iVar6 == '\0') {
      if (index_type != (char *)0x0) {
        pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (puVar12);
        iVar6 = (*pIVar7->_vptr_Index[3])(pIVar7);
        iVar6 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar6));
        if (iVar6 != 0) goto LAB_01135859;
      }
      bVar4 = true;
      bVar10 = true;
    }
    else {
LAB_01135859:
      bVar4 = false;
    }
  } while ((!bVar4) && (puVar12 = puVar12 + 1, puVar12 != puVar1));
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (bVar10) {
    this_00 = AttachedDatabase::GetCatalog(table_info->db);
    schema._M_dataplus._M_p = (pointer)&schema.field_2;
    pcVar2 = (table_info->schema)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&schema,pcVar2,pcVar2 + (table_info->schema)._M_string_length);
    DataTableInfo::GetTableName_abi_cxx11_(&table_name,table_info);
    entry = Catalog::GetEntry<duckdb::TableCatalogEntry>
                      (this_00,context,&schema,&table_name,THROW_EXCEPTION,
                       (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&entry);
    entry_00.ptr = entry.ptr;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = TableCatalogEntry::GetColumns(entry.ptr);
    CVar14 = ColumnList::Logical(this_01);
    pTVar8 = (TableCatalogEntry *)CVar14.list;
    if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_b8._8_8_ =
           ((long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid -
            (long)(((_Vector_impl *)
                   &(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                    _vptr_CatalogEntry)->super__Vector_impl_data)._M_start >> 3) *
           -0x7b425ed097b425ed;
    }
    else {
      local_b8._8_8_ =
           (long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment.type_
                 .type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
           *(long *)&(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment.
                     type_ >> 3;
    }
    local_b8._0_8_ = (_func_int **)0x0;
    if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var13 = (_func_int **)
                 (((long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid -
                   (long)(((_Vector_impl *)
                          &(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                           _vptr_CatalogEntry)->super__Vector_impl_data)._M_start >> 3) *
                 -0x7b425ed097b425ed);
    }
    else {
      pp_Var13 = (_func_int **)
                 ((long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                        comment.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  - *(long *)&(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                              comment.type_ >> 3);
    }
    if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      p_Var11 = (_Hash_node_base *)
                (((long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid -
                  (long)(((_Vector_impl *)
                         &(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                          _vptr_CatalogEntry)->super__Vector_impl_data)._M_start >> 3) *
                -0x7b425ed097b425ed);
    }
    else {
      p_Var11 = (_Hash_node_base *)
                ((long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment
                       .type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 - *(long *)&(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                             comment.type_ >> 3);
    }
    entry.ptr = pTVar8;
    if ((pp_Var13 != (_func_int **)0x0) || ((_Hash_node_base *)local_b8._8_8_ != p_Var11)) {
      do {
        do {
          this_02 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)&entry);
          __x = ColumnDefinition::Type(this_02);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&column_types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
          __x_00 = ColumnDefinition::Name_abi_cxx11_(this_02);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&column_names,__x_00);
          local_b8._0_8_ = local_b8._0_8_ + 1;
        } while ((_func_int **)local_b8._0_8_ != pp_Var13);
      } while (((_Hash_node_base *)local_b8._8_8_ != p_Var11) || (entry.ptr != pTVar8));
    }
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar6 != 0) {
      ::std::__throw_system_error(iVar6);
    }
    puVar12 = (this->indexes).
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->indexes).
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != puVar1) {
      do {
        pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (puVar12);
        iVar6 = (*pIVar7->_vptr_Index[2])(pIVar7);
        if ((char)iVar6 == '\0') {
          if (index_type != (char *)0x0) {
            pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                               (puVar12);
            iVar6 = (*pIVar7->_vptr_Index[3])(pIVar7);
            iVar6 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var_00,iVar6));
            if (iVar6 != 0) goto LAB_01135c0a;
          }
          Binder::CreateBinder
                    ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,
                     REGULAR_BINDER);
          dummy_column_ids.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          dummy_column_ids.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          dummy_column_ids.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pBVar9 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
          local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
          entry.ptr = (TableCatalogEntry *)local_b8;
          BindContext::AddBaseTable
                    (&pBVar9->bind_context,0,(string *)&entry,&column_names,&column_types,
                     &dummy_column_ids,entry_00.ptr,true);
          if (entry.ptr != (TableCatalogEntry *)local_b8) {
            operator_delete(entry.ptr);
          }
          binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
          IndexBinder::IndexBinder
                    ((IndexBinder *)&entry,binder_00,context,
                     (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
                     (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
          unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->(puVar12);
          IndexBinder::BindIndex((IndexBinder *)&bound_idx,(UnboundIndex *)&entry);
          uVar5 = bound_idx;
          bound_idx.super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>.
          _M_t.super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
          super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl =
               (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)
               (__uniq_ptr_data<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true,_true>
                )0x0;
          _Var3._M_head_impl =
               (puVar12->super_unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Index,_std::default_delete<duckdb::Index>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::Index_*,_std::default_delete<duckdb::Index>_>.
               super__Head_base<0UL,_duckdb::Index_*,_false>._M_head_impl;
          (puVar12->super_unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>_>)._M_t.
          super___uniq_ptr_impl<duckdb::Index,_std::default_delete<duckdb::Index>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Index_*,_std::default_delete<duckdb::Index>_>.
          super__Head_base<0UL,_duckdb::Index_*,_false>._M_head_impl =
               (Index *)uVar5.
                        super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
                        .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl;
          if (_Var3._M_head_impl != (Index *)0x0) {
            (**(code **)((long)(_Var3._M_head_impl)->_vptr_Index + 8))();
          }
          if (bound_idx.
              super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
              super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
              .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)bound_idx.
                                  super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
                                  .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl +
                        8))();
          }
          ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&entry);
          ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                    (&dummy_column_ids.
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
          if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (binder.internal.
                       super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
        }
LAB_01135c0a:
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&column_names);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)table_name._M_dataplus._M_p != &table_name.field_2) {
      operator_delete(table_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)schema._M_dataplus._M_p != &schema.field_2) {
      operator_delete(schema._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void TableIndexList::InitializeIndexes(ClientContext &context, DataTableInfo &table_info, const char *index_type) {
	// Fast path: do we have any unbound indexes?
	bool needs_binding = false;
	{
		lock_guard<mutex> lock(indexes_lock);
		for (auto &index : indexes) {
			if (!index->IsBound() && (index_type == nullptr || index->GetIndexType() == index_type)) {
				needs_binding = true;
				break;
			}
		}
	}
	if (!needs_binding) {
		return;
	}

	// Get the table from the catalog, so we can add it to the binder.
	auto &catalog = table_info.GetDB().GetCatalog();
	auto schema = table_info.GetSchemaName();
	auto table_name = table_info.GetTableName();
	auto &table_entry = catalog.GetEntry<TableCatalogEntry>(context, schema, table_name);
	auto &table = table_entry.Cast<DuckTableEntry>();

	vector<LogicalType> column_types;
	vector<string> column_names;
	for (auto &col : table.GetColumns().Logical()) {
		column_types.push_back(col.Type());
		column_names.push_back(col.Name());
	}

	lock_guard<mutex> lock(indexes_lock);
	for (auto &index : indexes) {
		if (!index->IsBound() && (index_type == nullptr || index->GetIndexType() == index_type)) {
			// Create a binder to bind this index.
			auto binder = Binder::CreateBinder(context);

			// Add the table to the binder.
			vector<ColumnIndex> dummy_column_ids;
			binder->bind_context.AddBaseTable(0, string(), column_names, column_types, dummy_column_ids, table);

			// Create an IndexBinder to bind the index
			IndexBinder idx_binder(*binder, context);

			// Replace the unbound index with a bound index.
			auto bound_idx = idx_binder.BindIndex(index->Cast<UnboundIndex>());
			index = std::move(bound_idx);
		}
	}
}